

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManDumpGnuplot(Emb_Man_t *p,char *pName,int fDumpLarge,int fShowImage)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  FILE *__stream;
  Vec_Int_t *p_00;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_t __size;
  char Buffer [1000];
  
  if (p->pPlacement == (unsigned_short *)0x0) {
    puts("Emb_ManDumpGnuplot(): Placement is not available.");
    return;
  }
  pcVar7 = Gia_FileNameGenericAppend(pName,".plt");
  sprintf(Buffer,"%s%s","",pcVar7);
  __stream = fopen(Buffer,"w");
  pcVar7 = Ioa_TimeStamp();
  fprintf(__stream,"# This Gnuplot file was produced by ABC on %s\n",pcVar7);
  fputc(10,__stream);
  fwrite("set nokey\n",10,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n",0x4e,
           1,__stream);
    pcVar7 = Gia_FileNameGenericAppend(pName,".gif");
    fprintf(__stream,"set output \'%s\'\n",pcVar7);
    fputc(10,__stream);
  }
  iVar2 = p->vCis->nSize;
  uVar5 = p->nRegs;
  iVar10 = p->vCos->nSize;
  uVar6 = p->nObjs;
  Emb_ManComputeHPWL(p);
  fprintf(__stream,
          "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n",
          pName,(ulong)(iVar2 - uVar5),(ulong)(iVar10 - uVar5),(ulong)uVar5,
          (ulong)(uVar6 - (iVar10 + iVar2)),(ulong)uVar6);
  pcVar7 = Ioa_TimeStamp();
  fprintf(__stream,"(image generated by ABC and Gnuplot on %s)\"",pcVar7);
  fwrite("font \"Times, 12\"\n",0x11,1,__stream);
  fputc(10,__stream);
  fwrite("plot [:] \'-\' w l\n",0x11,1,__stream);
  fputc(10,__stream);
  if (fDumpLarge == 0) {
    uVar8 = 0;
    while (((int)uVar8 < p->nObjData && (p->pObjData != (int *)0x0))) {
      puVar1 = (uint *)(p->pObjData + uVar8);
      if (puVar1[3] == p->nTravIds) {
        for (lVar9 = 0; uVar5 = puVar1[1], (int)lVar9 < (int)uVar5; lVar9 = lVar9 + 1) {
          uVar5 = puVar1[(ulong)(*puVar1 >> 4) + lVar9 + 5];
          if (puVar1[(long)(int)uVar5 + 3] != p->nTravIds) {
            __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                          ,0x6da,"void Emb_ManDumpGnuplot(Emb_Man_t *, char *, int, int)");
          }
          fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[4] * 2],
                  (ulong)p->pPlacement[(ulong)(puVar1[4] * 2) + 1]);
          fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[(long)(int)uVar5 + 4] * 2],
                  (ulong)p->pPlacement[(ulong)(puVar1[(long)(int)uVar5 + 4] * 2) + 1]);
          fputc(10,__stream);
        }
      }
      else {
        uVar5 = puVar1[1];
      }
      uVar8 = (ulong)(uVar5 + (int)uVar8 + (*puVar1 >> 4) + 5);
    }
  }
  else {
    p_00 = Emb_ManDumpGnuplotPrepare(p);
    iVar2 = p_00->nSize;
    for (iVar10 = 0; iVar10 < iVar2; iVar10 = iVar10 + 4) {
      iVar3 = Vec_IntEntry(p_00,iVar10);
      iVar4 = Vec_IntEntry(p_00,iVar10 + 1);
      uVar5 = Vec_IntEntry(p_00,iVar10 + 2);
      uVar6 = Vec_IntEntry(p_00,iVar10 + 3);
      fprintf(__stream,"%5d %5d\n",iVar3,iVar4);
      fprintf(__stream,"%5d %5d\n",(ulong)uVar5,(ulong)uVar6);
      fputc(10,__stream);
    }
    Vec_IntFree(p_00);
  }
  fwrite("EOF\n",4,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("# pause -1 \"Close window\"\n",0x1a,1,__stream);
    pcVar7 = "# reset\n";
    __size = 8;
  }
  else {
    fwrite("pause -1 \"Close window\"\n",0x18,1,__stream);
    pcVar7 = "reset\n";
    __size = 6;
  }
  fwrite(pcVar7,__size,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  if (fShowImage != 0) {
    Gia_ManGnuplotShow(Buffer);
  }
  return;
}

Assistant:

void Emb_ManDumpGnuplot( Emb_Man_t * p, char * pName, int fDumpLarge, int fShowImage )
{
    extern void Gia_ManGnuplotShow( char * pPlotFileName );
//    char * pDirectory = "place\\";
    char * pDirectory = "";
//    extern char * Ioa_TimeStamp();
    FILE * pFile;
    char Buffer[1000];
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    if ( p->pPlacement == NULL )
    {
        printf( "Emb_ManDumpGnuplot(): Placement is not available.\n" );
        return;
    }
    sprintf( Buffer, "%s%s", pDirectory, Gia_FileNameGenericAppend(pName, ".plt") ); 
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# This Gnuplot file was produced by ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "\n" );
    fprintf( pFile, "set nokey\n" );
    fprintf( pFile, "\n" );
    if ( !fShowImage )
    {
//    fprintf( pFile, "set terminal postscript\n" );
    fprintf( pFile, "set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n" );
    fprintf( pFile, "set output \'%s\'\n", Gia_FileNameGenericAppend(pName, ".gif") );
    fprintf( pFile, "\n" );
    }
    fprintf( pFile, "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n", 
        pName, Emb_ManPiNum(p), Emb_ManPoNum(p), Emb_ManRegNum(p), Emb_ManNodeNum(p), Emb_ManObjNum(p), Emb_ManComputeHPWL(p) );
    fprintf( pFile, "(image generated by ABC and Gnuplot on %s)\"", Ioa_TimeStamp() );
    fprintf( pFile, "font \"Times, 12\"\n" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "plot [:] '-' w l\n" );
    fprintf( pFile, "\n" );
    if ( fDumpLarge )
    {
        int begX, begY, endX, endY;
        Vec_Int_t * vLines = Emb_ManDumpGnuplotPrepare( p );
        Vec_IntForEachEntry( vLines, begX, i )
        {
            begY = Vec_IntEntry( vLines, i+1 );
            endX = Vec_IntEntry( vLines, i+2 );
            endY = Vec_IntEntry( vLines, i+3 );
            i += 3;
            fprintf( pFile, "%5d %5d\n", begX, begY );
            fprintf( pFile, "%5d %5d\n", endX, endY );
            fprintf( pFile, "\n" );
        }
        Vec_IntFree( vLines );
    }
    else
    {
        Emb_ManForEachObj( p, pThis, i )
        {
            if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
                continue;
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                assert( Emb_ObjIsTravIdCurrent(p, pNext) );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pThis->Value+0], p->pPlacement[2*pThis->Value+1] );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pNext->Value+0], p->pPlacement[2*pNext->Value+1] );
                fprintf( pFile, "\n" );
            }
        }
    }
    fprintf( pFile, "EOF\n" );
    fprintf( pFile, "\n" );
    if ( fShowImage )
    {
    fprintf( pFile, "pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "reset\n" );
    fprintf( pFile, "\n" );
    }
    else
    {
    fprintf( pFile, "# pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "# reset\n" );
    fprintf( pFile, "\n" );
    }
    fclose( pFile );
    if ( fShowImage )
        Gia_ManGnuplotShow( Buffer );
}